

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int __thiscall CDemoPlayer::Stop(CDemoPlayer *this)

{
  long in_RDI;
  int local_4;
  
  if (*(long *)(in_RDI + 0x4048) == 0) {
    local_4 = -1;
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x18) + 200))
              (*(long **)(in_RDI + 0x18),0,"demo_player","Stopped playback");
    io_close((IOHANDLE)0x2393df);
    *(undefined8 *)(in_RDI + 0x4048) = 0;
    mem_free((void *)0x2393fa);
    *(undefined8 *)(in_RDI + 0x4250) = 0;
    *(undefined1 *)(in_RDI + 0x4050) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CDemoPlayer::Stop()
{
	if(!m_File)
		return -1;

	m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "demo_player", "Stopped playback");
	io_close(m_File);
	m_File = 0;
	mem_free(m_pKeyFrames);
	m_pKeyFrames = 0;
	m_aFilename[0] = '\0';
	return 0;
}